

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateDefaultConstructorCall
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,ExprBase *pointer)

{
  uint uVar1;
  Allocator *pAVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  ArrayView<FunctionValue> functions_00;
  InplaceStr name;
  SmallArray<FunctionValue,_32U> functions;
  
  if ((pointer->type == (TypeBase *)0x0) ||
     ((uVar1 = pointer->type->typeID, uVar1 != 0x12 && (uVar1 != 0x14)))) {
    __assert_fail("isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x2747,
                  "ExprBase *CreateDefaultConstructorCall(ExpressionContext &, SynBase *, TypeBase *, ExprBase *)"
                 );
  }
  if (type == (TypeBase *)0x0) {
LAB_0015a69b:
    pEVar7 = CreateConstructorAccess(ctx,source,type,true,pointer);
    if (pEVar7 != (ExprBase *)0x0) {
      pAVar2 = ctx->allocator;
      memset(functions.little,0,0x300);
      functions.count = 0;
      functions.max = 0x20;
      functions.data = functions.little;
      functions.allocator = pAVar2;
      GetNodeFunctions(ctx,source,pEVar7,&functions);
      functions_00.count = functions.count;
      functions_00.data = functions.data;
      functions_00._12_4_ = 0;
      pEVar7 = CreateFunctionCallOverloaded
                         (ctx,source,pEVar7,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                          (SynCallArgument *)0x0,false);
      SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
      return pEVar7;
    }
  }
  else {
    if (type->typeID == 0x13) {
      lVar6 = 0x60;
    }
    else {
      if (type->typeID != 0x14) goto LAB_0015a69b;
      lVar6 = 0x88;
    }
    bVar4 = HasDefaultConstructor(ctx,source,*(TypeBase **)((long)&type->_vptr_TypeBase + lVar6));
    if (bVar4) {
      pTVar3 = pointer->type;
      if ((pTVar3 != (TypeBase *)0x0) && (pTVar3->typeID == 0x12)) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
        pTVar3 = (TypeBase *)pTVar3[1]._vptr_TypeBase;
        pEVar7->typeID = 0x16;
        pEVar7->source = source;
        pEVar7->type = pTVar3;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
        pEVar7[1]._vptr_ExprBase = (_func_int **)pointer;
        pointer = pEVar7;
      }
      name.end = "";
      name.begin = "__init_array";
      pEVar7 = CreateFunctionCall1(ctx,source,name,pointer,false,true,true);
      return pEVar7;
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* CreateDefaultConstructorCall(ExpressionContext &ctx, SynBase *source, TypeBase *type, ExprBase *pointer)
{
	assert(isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type));

	if(isType<TypeArray>(type) || isType<TypeUnsizedArray>(type))
	{
		if(TypeArray *arrType = getType<TypeArray>(type))
			type = arrType->subType;
		else if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			type = arrType->subType;

		if(HasDefaultConstructor(ctx, source, type))
		{
			if(TypeRef *typeRef = getType<TypeRef>(pointer->type))
				return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), new (ctx.get<ExprDereference>()) ExprDereference(source, typeRef->subType, pointer), false, true, true);

			return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), pointer, false, true, true);
		}

		return NULL;
	}

	if(ExprBase *constructor = CreateConstructorAccess(ctx, source, type, true, pointer))
	{
		// Collect a set of available functions
		SmallArray<FunctionValue, 32> functions(ctx.allocator);

		GetNodeFunctions(ctx, source, constructor, functions);

		return CreateFunctionCallOverloaded(ctx, source, constructor, functions, IntrusiveList<TypeHandle>(), NULL, false);
	}

	return NULL;
}